

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O2

void __thiscall Clasp::LoopFormula::reason(LoopFormula *this,Solver *s,Literal p,LitVec *lits)

{
  uint uVar1;
  ulong in_RAX;
  uint *puVar2;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  for (puVar2 = (uint *)((long)&this[1].super_Constraint._vptr_Constraint +
                        (ulong)(this->other_ == *(uint *)&this->field_0x10 >> 0x1f) * 4 + 4);
      uVar1 = *puVar2, 3 < uVar1; puVar2 = puVar2 + 1) {
    if (1 < (uVar1 ^ p.rep_)) {
      uStack_38 = CONCAT44(uVar1,(undefined4)uStack_38) & 0xfffffffeffffffff ^ 0x200000000;
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                (lits,(Literal *)((long)&uStack_38 + 4));
    }
  }
  Solver::updateOnReason(s,&this->act_,p,lits);
  return;
}

Assistant:

void LoopFormula::reason(Solver& s, Literal p, LitVec& lits) {
	// p = body: all literals in active clause
	// p = atom: only bodies
	for (Literal* it = begin() + (other_ == xPos_); !isSentinel(*it); ++it) {
		if (*it != p) { lits.push_back(~*it); }
	}
	s.updateOnReason(act_, p, lits);
}